

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_strtype.cc
# Opt level: O3

string * __thiscall
StringType::GenStringSize_abi_cxx11_
          (string *__return_storage_ptr__,StringType *this,Output *out_cc,Env *env,DataPtr *data)

{
  uint uVar1;
  char *__s;
  ID *id;
  allocator<char> local_29;
  
  uVar1 = (*(this->super_Type).super_DataDepElement._vptr_DataDepElement[0x13])(this,env);
  if ((int)uVar1 < 0) {
    (*(this->super_Type).super_DataDepElement._vptr_DataDepElement[0x1a])(this,out_cc,env,data);
    if (this->string_length_var_field_ == (Field *)0x0) {
      id = (ID *)0x0;
    }
    else {
      id = this->string_length_var_field_->id_;
    }
    __s = Env::RValue(env,id);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_29);
  }
  else {
    strfmt_abi_cxx11_(__return_storage_ptr__,"%d",(ulong)uVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

string StringType::GenStringSize(Output* out_cc, Env* env, const DataPtr& data)
	{
	int static_size = StaticSize(env);
	if ( static_size >= 0 )
		return strfmt("%d", static_size);
	GenDynamicSize(out_cc, env, data);
	return env->RValue(string_length_var());
	}